

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O3

idx_t duckdb::BitStringAggOperation::GetRange<unsigned_long>(unsigned_long min,unsigned_long max)

{
  bool bVar1;
  InvalidInputException *this;
  pointer pcVar2;
  unsigned_long result;
  string local_48;
  
  if (min <= max) {
    bVar1 = TrySubtractOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                      (max,min,(uint64_t *)&local_48);
    pcVar2 = local_48._M_dataplus._M_p + 1;
    if (pcVar2 == (pointer)0x0) {
      pcVar2 = (pointer)0xffffffffffffffff;
    }
    if (!bVar1) {
      pcVar2 = (pointer)0xffffffffffffffff;
    }
    return (idx_t)pcVar2;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Invalid explicit bitstring range: Minimum (%d) > maximum (%d)","")
  ;
  InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>(this,&local_48,min,max);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static idx_t GetRange(INPUT_TYPE min, INPUT_TYPE max) {
		if (min > max) {
			throw InvalidInputException("Invalid explicit bitstring range: Minimum (%d) > maximum (%d)", min, max);
		}
		INPUT_TYPE result;
		if (!TrySubtractOperator::Operation(max, min, result)) {
			return NumericLimits<idx_t>::Maximum();
		}
		auto val = NumericCast<idx_t>(result);
		if (val == NumericLimits<idx_t>::Maximum()) {
			return val;
		}
		return val + 1;
	}